

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astReturnNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_stackFrameRecord_t *targetRecord;
  anon_struct_8_1_6971b95b gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_58;
  sysbvm_stackFrameRecord_t local_50;
  undefined8 local_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_58 = 0x2f;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 1;
  local_20 = (undefined1 *)&local_58;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_40 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_50);
  if (*(sysbvm_tuple_t *)(*arguments + 0x28) != 0) {
    local_58 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                         (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  }
  sVar1 = sysbvm_environment_lookReturnTargetRecursively(context,arguments[1]);
  if (sVar1 != 0) {
    if ((sVar1 & 0xf) == 0) {
      targetRecord = *(sysbvm_stackFrameRecord_t **)(sVar1 + 0x10);
    }
    else {
      targetRecord = (sysbvm_stackFrameRecord_t *)((long)sVar1 >> 4);
    }
    sysbvm_stackFrame_returnValueInto(local_58,targetRecord);
    return 0;
  }
  sysbvm_error("No target available for returning value.");
}

Assistant:

static sysbvm_tuple_t sysbvm_astReturnNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astReturnNode_t **returnNode = (sysbvm_astReturnNode_t**)node;

    struct {
        sysbvm_tuple_t result;
    } gcFrame = {
        .result = SYSBVM_VOID_TUPLE
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*returnNode)->super.sourcePosition);

    if((*returnNode)->expression)
        gcFrame.result = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*returnNode)->expression, *environment);
    
    sysbvm_tuple_t returnTarget = sysbvm_environment_lookReturnTargetRecursively(context, *environment);
    if(!returnTarget)
        sysbvm_error("No target available for returning value.");

    sysbvm_stackFrame_returnValueInto(gcFrame.result, (sysbvm_stackFrameRecord_t*)sysbvm_tuple_uintptr_decode(returnTarget));
    return SYSBVM_NULL_TUPLE;
}